

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchChoice.c
# Opt level: O2

int Dch_DeriveChoiceCountReprs(Aig_Man_t *pAig)

{
  Aig_Obj_t *pAVar1;
  void *pvVar2;
  int i;
  int iVar3;
  
  i = 0;
  iVar3 = 0;
  do {
    if (pAig->vObjs->nSize <= i) {
      return iVar3;
    }
    pvVar2 = Vec_PtrEntry(pAig->vObjs,i);
    if ((pvVar2 != (void *)0x0) && (pAig->pReprs != (Aig_Obj_t **)0x0)) {
      pAVar1 = pAig->pReprs[*(int *)((long)pvVar2 + 0x24)];
      if (pAVar1 != (Aig_Obj_t *)0x0) {
        if (*(int *)((long)pvVar2 + 0x24) <= pAVar1->Id) {
          __assert_fail("pRepr->Id < pObj->Id",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchChoice.c"
                        ,0x54,"int Dch_DeriveChoiceCountReprs(Aig_Man_t *)");
        }
        iVar3 = iVar3 + 1;
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

int Dch_DeriveChoiceCountReprs( Aig_Man_t * pAig )
{
    Aig_Obj_t * pObj, * pRepr;
    int i, nReprs = 0;
    Aig_ManForEachObj( pAig, pObj, i )
    {
        pRepr = Aig_ObjRepr( pAig, pObj );
        if ( pRepr == NULL )
            continue;
        assert( pRepr->Id < pObj->Id );
        nReprs++;
    }
    return nReprs;
}